

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O2

void __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Insert
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,String<char> *key,
          Value<char> *value)

{
  Char_T *key_00;
  long lVar1;
  int iVar2;
  SizeT *in_RAX;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  SizeT *index;
  
  index = in_RAX;
  if ((this->
      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      ).index_ ==
      (this->
      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      ).capacity_) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    expand(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          );
  }
  key_00 = key->storage_;
  uVar7 = (ulong)key->length_;
  iVar2 = 0x21;
  uVar4 = 0xb;
  iVar5 = 0;
  for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
    iVar8 = iVar2 * (uint)uVar6;
    iVar2 = iVar2 + iVar5;
    iVar5 = iVar5 + 2;
    uVar9 = (uint)uVar7;
    lVar1 = uVar7 - 1;
    uVar7 = uVar7 - 1;
    uVar4 = (int)key_00[lVar1] + (uVar9 ^ (uint)uVar6) * (key_00[uVar6] * iVar8 + uVar4);
  }
  pHVar3 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                  ,&index,key_00,key->length_,uVar4 | 0x80000000);
  if (pHVar3 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    pHVar3 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::insert(&this->
                       super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      ,index,key,uVar4 | 0x80000000);
    Value<char>::Value(&pHVar3->Value,value);
  }
  else {
    Value<char>::operator=(&pHVar3->Value,value);
  }
  return;
}

Assistant:

void Insert(Key_T &&key, Value_T &&value) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key.First(), key.Length());
        SizeT      *index;
        HItem      *item = find(index, key.First(), key.Length(), hash);

        if (item == nullptr) {
            item = insert(index, Memory::Move(key), hash);
            Memory::Initialize(&(item->Value), Memory::Move(value));
        } else {
            item->Value = Memory::Move(value);
        }
    }